

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber *
uprv_decNumberFMA_63(decNumber *res,decNumber *lhs,decNumber *rhs,decNumber *fhs,decContext *set)

{
  undefined4 uVar1;
  decNumber *pdVar2;
  uint32_t uVar3;
  int iVar4;
  uint local_c8;
  undefined1 local_c4 [8];
  decNumber dzero;
  decNumber *acc;
  decNumber *allocbufa;
  decNumber bufa [7];
  uint32_t needbytes;
  decContext dcmul;
  uint32_t status;
  decContext *set_local;
  decNumber *fhs_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  dcmul.status = 0;
  acc = (decNumber *)0x0;
  unique0x10000271 = set;
  if (((((lhs->bits & 0x70) != 0) || (uVar3 = decCheckMath(lhs,set,&dcmul.status), uVar3 == 0)) &&
      (((rhs->bits & 0x70) != 0 ||
       (uVar3 = decCheckMath(rhs,stack0xffffffffffffffd0,&dcmul.status), uVar3 == 0)))) &&
     (((fhs->bits & 0x70) != 0 ||
      (uVar3 = decCheckMath(fhs,stack0xffffffffffffffd0,&dcmul.status), uVar3 == 0)))) {
    uVar1 = stack0xffffffffffffffd0->round;
    dcmul.emin = stack0xffffffffffffffd0->traps;
    dcmul.round = stack0xffffffffffffffd0->status;
    dcmul.traps = *(uint32_t *)&stack0xffffffffffffffd0->clamp;
    iVar4 = lhs->digits + rhs->digits;
    stack0xffffffffffffffb0 = CONCAT44(999999999,iVar4);
    dcmul.emax = uVar1;
    dcmul.digits = -999999999;
    dzero._4_8_ = &allocbufa;
    if (iVar4 < 0x32) {
      local_c8 = (uint)""[iVar4];
    }
    else {
      local_c8 = iVar4 / 1;
    }
    bufa[6].exponent = local_c8 + 0xb;
    pdVar2 = (decNumber *)dzero._4_8_;
    if (((uint)bufa[6].exponent < 0x55) ||
       (acc = (decNumber *)uprv_malloc_63((ulong)(uint)bufa[6].exponent), pdVar2 = acc,
       acc != (decNumber *)0x0)) {
      dzero._4_8_ = pdVar2;
      decMultiplyOp((decNumber *)dzero._4_8_,lhs,rhs,(decContext *)&bufa[6].bits,&dcmul.status);
      set_local = (decContext *)fhs;
      if ((dcmul.status & 0x80) != 0) {
        if ((dcmul.status & 0x40000000) == 0) {
          uprv_decNumberZero_63(res);
          res->bits = ' ';
          goto LAB_002aacdd;
        }
        uprv_decNumberZero_63((decNumber *)local_c4);
        set_local = (decContext *)local_c4;
      }
      decAddOp(res,(decNumber *)dzero._4_8_,(decNumber *)set_local,stack0xffffffffffffffd0,'\0',
               &dcmul.status);
    }
    else {
      dcmul.status = dcmul.status | 0x10;
    }
  }
LAB_002aacdd:
  if (acc != (decNumber *)0x0) {
    uprv_free_63(acc);
  }
  if (dcmul.status != 0) {
    decStatus(res,dcmul.status,stack0xffffffffffffffd0);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFMA(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, const decNumber *fhs,
                         decContext *set) {
  uInt status=0;                   /* accumulator  */
  decContext dcmul;                /* context for the multiplication  */
  uInt needbytes;                  /* for space calculations  */
  decNumber bufa[D2N(DECBUFFER*2+1)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *acc;                  /* accumulator pointer  */
  decNumber dzero;                 /* work  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  if (decCheckOperands(res, fhs, DECUNUSED, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {               /* [undefined if subset]  */
      status|=DEC_Invalid_operation;
      break;}
    #endif
    /* Check math restrictions [these ensure no overflow or underflow]  */
    if ((!decNumberIsSpecial(lhs) && decCheckMath(lhs, set, &status))
     || (!decNumberIsSpecial(rhs) && decCheckMath(rhs, set, &status))
     || (!decNumberIsSpecial(fhs) && decCheckMath(fhs, set, &status))) break;
    /* set up context for multiply  */
    dcmul=*set;
    dcmul.digits=lhs->digits+rhs->digits; /* just enough  */
    /* [The above may be an over-estimate for subset arithmetic, but that's OK]  */
    dcmul.emax=DEC_MAX_EMAX;            /* effectively unbounded ..  */
    dcmul.emin=DEC_MIN_EMIN;            /* [thanks to Math restrictions]  */
    /* set up decNumber space to receive the result of the multiply  */
    acc=bufa;                           /* may fit  */
    needbytes=sizeof(decNumber)+(D2U(dcmul.digits)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufa)) {       /* need malloc space  */
      allocbufa=(decNumber *)malloc(needbytes);
      if (allocbufa==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      acc=allocbufa;                    /* use the allocated space  */
      }
    /* multiply with extended range and necessary precision  */
    /*printf("emin=%ld\n", dcmul.emin);  */
    decMultiplyOp(acc, lhs, rhs, &dcmul, &status);
    /* Only Invalid operation (from sNaN or Inf * 0) is possible in  */
    /* status; if either is seen than ignore fhs (in case it is  */
    /* another sNaN) and set acc to NaN unless we had an sNaN  */
    /* [decMultiplyOp leaves that to caller]  */
    /* Note sNaN has to go through addOp to shorten payload if  */
    /* necessary  */
    if ((status&DEC_Invalid_operation)!=0) {
      if (!(status&DEC_sNaN)) {         /* but be true invalid  */
        uprv_decNumberZero(res);             /* acc not yet set  */
        res->bits=DECNAN;
        break;
        }
      uprv_decNumberZero(&dzero);            /* make 0 (any non-NaN would do)  */
      fhs=&dzero;                       /* use that  */
      }
    #if DECCHECK
     else { /* multiply was OK  */
      if (status!=0) printf("Status=%08lx after FMA multiply\n", (LI)status);
      }
    #endif
    /* add the third operand and result -> res, and all is done  */
    decAddOp(res, acc, fhs, set, 0, &status);
    } while(0);                         /* end protected  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }